

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_entropy.c
# Opt level: O2

_Bool check_arguments(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,
                     inform_error *err)

{
  size_t *psVar1;
  int *piVar2;
  size_t *psVar3;
  ulong *puVar4;
  size_t sVar5;
  inform_error iVar6;
  size_t i;
  size_t sVar7;
  long lVar8;
  size_t i_2;
  double dVar9;
  double local_58;
  
  if (series == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_ETIMESERIES;
    goto LAB_001089c9;
  }
  if (l == 0) {
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_ENOSOURCES;
    goto LAB_001089c9;
  }
  if (n == 0) {
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_ENOINITS;
    goto LAB_001089c9;
  }
  if (m == 0) {
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_ESHORTSERIES;
    goto LAB_001089c9;
  }
  if (b == (int *)0x0) {
LAB_001089c2:
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_EBASE;
    goto LAB_001089c9;
  }
  if (r != (size_t *)0x0) {
    if (s == (size_t *)0x0) {
      sVar7 = 0;
      do {
        if (l == sVar7) goto LAB_0010894b;
        puVar4 = r + sVar7;
        if (*puVar4 == 0) goto LAB_001089dd;
        sVar7 = sVar7 + 1;
      } while (*puVar4 <= m);
    }
    else {
      sVar7 = 0;
      do {
        if (l == sVar7) goto LAB_0010894b;
        psVar3 = r + sVar7;
        psVar1 = s + sVar7;
        if (*psVar3 == 0 && *psVar1 == 0) goto LAB_001089dd;
        sVar7 = sVar7 + 1;
      } while (*psVar1 + *psVar3 <= m);
    }
    if (err == (inform_error *)0x0) {
      return true;
    }
    iVar6 = INFORM_EKLONG;
    goto LAB_001089c9;
  }
  local_58 = 0.0;
  for (sVar7 = 0; l != sVar7; sVar7 = sVar7 + 1) {
    if (b[sVar7] < 2) goto LAB_001089c2;
    dVar9 = log2((double)b[sVar7]);
    local_58 = local_58 + dVar9;
  }
  goto LAB_001089eb;
LAB_001089dd:
  if (err == (inform_error *)0x0) {
    return true;
  }
  iVar6 = INFORM_EKZERO;
  goto LAB_001089c9;
LAB_0010894b:
  local_58 = 0.0;
  for (sVar7 = 0; l != sVar7; sVar7 = sVar7 + 1) {
    if (b[sVar7] < 2) goto LAB_001089c2;
    sVar5 = r[sVar7];
    dVar9 = log2((double)b[sVar7]);
    local_58 = local_58 +
               dVar9 * (((double)CONCAT44(0x45300000,(int)(sVar5 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
  }
LAB_001089eb:
  if (s != (size_t *)0x0) {
    for (sVar7 = 0; l != sVar7; sVar7 = sVar7 + 1) {
      sVar5 = s[sVar7];
      dVar9 = log2((double)b[sVar7]);
      local_58 = local_58 +
                 dVar9 * (((double)CONCAT44(0x45300000,(int)(sVar5 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    }
  }
  if (local_58 <= 30.0) {
    sVar7 = 0;
    do {
      if (sVar7 == l) {
        return false;
      }
      lVar8 = 0;
      while (m * n - lVar8 != 0) {
        piVar2 = series + lVar8;
        if (*piVar2 < 0) {
          if (err == (inform_error *)0x0) {
            return true;
          }
          iVar6 = INFORM_ENEGSTATE;
          goto LAB_001089c9;
        }
        lVar8 = lVar8 + 1;
        if (b[sVar7] <= *piVar2) {
          if (err == (inform_error *)0x0) {
            return true;
          }
          iVar6 = INFORM_EBADSTATE;
          goto LAB_001089c9;
        }
      }
      sVar7 = sVar7 + 1;
      series = series + m * n;
    } while( true );
  }
  if (err == (inform_error *)0x0) {
    return true;
  }
  iVar6 = INFORM_EENCODE;
LAB_001089c9:
  *err = iVar6;
  return true;
}

Assistant:

static bool check_arguments(int const *src, int const *dst, int const *back,
    size_t l, size_t n, size_t m, int b, size_t k, inform_error *err)
{
    if (src == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (dst == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (back == NULL && l != 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, true);
    }
    else if (n < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOINITS, true);
    }
    else if (m < 2)
    {
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, true);
    }
    else if (b < 2)
    {
        INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
    }
    else if (m <= k)
    {
        INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
    }
    else if (k == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
    }
    for (size_t i = 0; i < n * m; ++i)
    {
        if (b <= src[i] || b <= dst[i])
        {
            INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
        }
        else if (src[i] < 0 || dst[i] < 0)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
        }
    }
    if (back != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            for (size_t j = 0; j < n * m; ++j)
            {
                if (b <= back[j + n*m*i])
                {
                    INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
                }
                else if (back[j + n*m*i] < 0)
                {
                    INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
                }
            }
        }
    }
    return false;
}